

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlChar * xmlSchemaFormatItemForReport
                    (xmlChar **buf,xmlChar *itemDes,xmlSchemaBasicItemPtr item,xmlNodePtr itemNode)

{
  uint uVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  char *pcVar4;
  xmlSchemaBasicItemPtr pxVar5;
  xmlSchemaElementPtr elem;
  xmlChar *local_30;
  
  local_30 = (xmlChar *)0x0;
  if (*buf != (xmlChar *)0x0) {
    (*xmlFree)(*buf);
    *buf = (xmlChar *)0x0;
  }
  if (itemDes == (xmlChar *)0x0) goto switchD_0018a4b1_caseD_3;
  switch(*(int *)itemDes) {
  case 1:
    uVar1 = *(uint *)(itemDes + 0x58);
    if ((uVar1 >> 8 & 1) == 0) {
      if ((uVar1 & 0x40) == 0) {
        pcVar4 = "union type \'xs:";
        if (-1 < (char)uVar1) {
          pcVar4 = "simple type \'xs:";
        }
      }
      else {
        pcVar4 = "list type \'xs:";
      }
    }
    else {
      pcVar4 = "atomic type \'xs:";
    }
    pxVar2 = xmlStrdup((xmlChar *)pcVar4);
    goto LAB_0018a8d0;
  case 2:
  case 0x15:
    if (*(int *)(itemDes + 0x28) - 1U < 3) {
      pcVar4 = &DAT_001d1f50 + *(int *)(&DAT_001d1f50 + (ulong)(*(int *)(itemDes + 0x28) - 1U) * 4);
    }
    else {
      pcVar4 = "invalid process contents";
    }
    pxVar3 = xmlStrdup((xmlChar *)pcVar4);
    *buf = pxVar3;
    pcVar4 = " wildcard";
    goto LAB_0018a8ec;
  case 3:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x13:
  case 0x14:
    goto switchD_0018a4b1_caseD_3;
  case 4:
    pxVar3 = "";
    if ((itemDes[0x58] & 8) == 0) {
      pxVar3 = "local ";
    }
    pxVar3 = xmlStrdup(pxVar3);
    *buf = pxVar3;
    uVar1 = *(uint *)(itemDes + 0x58);
    if ((uVar1 >> 8 & 1) == 0) {
      if ((uVar1 & 0x40) == 0) {
        pcVar4 = "union type";
        if (-1 < (char)uVar1) {
          pcVar4 = "simple type";
        }
      }
      else {
        pcVar4 = "list type";
      }
    }
    else {
      pcVar4 = "atomic type";
    }
    goto LAB_0018a8af;
  case 5:
    pxVar3 = "";
    if ((itemDes[0x58] & 8) == 0) {
      pxVar3 = "local ";
    }
    pxVar3 = xmlStrdup(pxVar3);
    *buf = pxVar3;
    pcVar4 = "complex type";
LAB_0018a8af:
    pxVar3 = xmlStrcat(pxVar3,(xmlChar *)pcVar4);
    *buf = pxVar3;
    if ((itemDes[0x58] & 8) != 0) {
      pxVar2 = xmlStrcat(pxVar3," \'");
LAB_0018a8d0:
      *buf = pxVar2;
      pxVar3 = *(xmlChar **)(itemDes + 0x10);
      goto LAB_0018a8da;
    }
    break;
  case 6:
  case 7:
  case 8:
  case 0x19:
    pxVar3 = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)itemDes);
    pxVar3 = xmlStrdup(pxVar3);
    goto LAB_0018a8f1;
  case 0xe:
    pxVar3 = xmlStrdup((xmlChar *)"element decl.");
    *buf = pxVar3;
    pxVar2 = xmlStrcat(pxVar3," \'");
    *buf = pxVar2;
    pxVar3 = xmlSchemaFormatQName
                       (&local_30,*(xmlChar **)(itemDes + 0x60),*(xmlChar **)(itemDes + 0x10));
    goto LAB_0018a8da;
  case 0xf:
    pxVar3 = xmlStrdup((xmlChar *)"attribute decl.");
    *buf = pxVar3;
    pxVar3 = xmlStrcat(pxVar3," \'");
    *buf = pxVar3;
    pxVar2 = xmlSchemaFormatQName
                       (&local_30,*(xmlChar **)(itemDes + 0x70),*(xmlChar **)(itemDes + 0x10));
LAB_0018a72a:
    pxVar3 = xmlStrcat(pxVar3,pxVar2);
    *buf = pxVar3;
    if (local_30 != (xmlChar *)0x0) {
      (*xmlFree)(local_30);
      local_30 = (xmlChar *)0x0;
      pxVar3 = *buf;
    }
    goto LAB_0018a8e2;
  case 0x10:
    xmlSchemaGetComponentDesignation(buf,itemDes);
    break;
  case 0x11:
    pxVar3 = xmlStrdup((xmlChar *)"model group def.");
    *buf = pxVar3;
    pxVar3 = xmlStrcat(pxVar3," \'");
    *buf = pxVar3;
    pxVar2 = xmlSchemaGetComponentQName(&local_30,itemDes);
    pxVar3 = xmlStrcat(pxVar3,pxVar2);
    *buf = pxVar3;
    pxVar3 = xmlStrcat(pxVar3,"\'");
    *buf = pxVar3;
    if (local_30 != (xmlChar *)0x0) {
      (*xmlFree)(local_30);
      local_30 = (xmlChar *)0x0;
    }
    break;
  case 0x12:
    pxVar3 = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)itemDes);
    pxVar3 = xmlStrdup(pxVar3);
    *buf = pxVar3;
    pxVar3 = xmlStrcat(pxVar3," \'");
    *buf = pxVar3;
    pxVar2 = xmlSchemaGetComponentQName(&local_30,itemDes);
    pxVar3 = xmlStrcat(pxVar3,pxVar2);
    *buf = pxVar3;
    pxVar3 = xmlStrcat(pxVar3,"\'");
    *buf = pxVar3;
    if (local_30 != (xmlChar *)0x0) {
      (*xmlFree)(local_30);
      local_30 = (xmlChar *)0x0;
    }
switchD_0018a4b1_caseD_3:
    if (item == (xmlSchemaBasicItemPtr)0x0) goto LAB_0018a982;
    pxVar5 = item;
    if (*(int *)&item->dummy == 2) {
      pxVar5 = (xmlSchemaBasicItemPtr)item[2].dummy;
    }
    pxVar3 = xmlStrdup((xmlChar *)"Element \'");
    *buf = pxVar3;
    if (pxVar5[4].dummy == (void *)0x0) {
      pxVar3 = xmlStrcat(pxVar3,*(xmlChar **)(pxVar5 + 1));
      *buf = pxVar3;
    }
    else {
      pxVar2 = xmlSchemaFormatQName
                         (&local_30,*(xmlChar **)((long)pxVar5[4].dummy + 0x10),
                          *(xmlChar **)(pxVar5 + 1));
      pxVar3 = xmlStrcat(pxVar3,pxVar2);
      *buf = pxVar3;
      if (local_30 != (xmlChar *)0x0) {
        (*xmlFree)(local_30);
        local_30 = (xmlChar *)0x0;
        pxVar3 = *buf;
      }
    }
    pxVar3 = xmlStrcat(pxVar3,"\'");
    *buf = pxVar3;
    goto LAB_0018a8fd;
  case 0x16:
    pcVar4 = "unique \'";
    goto LAB_0018a846;
  case 0x17:
    pcVar4 = "key \'";
    goto LAB_0018a846;
  case 0x18:
    pcVar4 = "keyRef \'";
LAB_0018a846:
    pxVar2 = xmlStrdup((xmlChar *)pcVar4);
    *buf = pxVar2;
    pxVar3 = *(xmlChar **)(itemDes + 0x20);
LAB_0018a8da:
    pxVar3 = xmlStrcat(pxVar2,pxVar3);
    *buf = pxVar3;
LAB_0018a8e2:
    pcVar4 = "\'";
LAB_0018a8ec:
    pxVar3 = xmlStrcat(pxVar3,(xmlChar *)pcVar4);
LAB_0018a8f1:
    *buf = pxVar3;
    break;
  case 0x1a:
    pxVar3 = xmlStrdup((xmlChar *)"attribute use ");
    *buf = pxVar3;
    if (*(long *)(itemDes + 0x18) != 0) {
      pxVar3 = xmlStrcat(pxVar3,"\'");
      *buf = pxVar3;
      pxVar2 = xmlSchemaGetComponentQName(&local_30,*(void **)(itemDes + 0x18));
      goto LAB_0018a72a;
    }
    pcVar4 = "(unknown)";
    goto LAB_0018a8ec;
  default:
    if (0xb < *(int *)itemDes - 1000U) goto switchD_0018a4b1_caseD_3;
    pxVar2 = xmlStrdup((xmlChar *)"facet \'");
    *buf = pxVar2;
    pxVar3 = xmlSchemaFacetTypeToString(*(xmlSchemaTypeType *)itemDes);
    goto LAB_0018a8da;
  }
  if (item != (xmlSchemaBasicItemPtr)0x0) {
LAB_0018a8fd:
    if (*(int *)&item->dummy == 2) {
      pxVar3 = xmlStrcat(*buf,(xmlChar *)", attribute \'");
      *buf = pxVar3;
      if (item[4].dummy == (void *)0x0) {
        pxVar3 = xmlStrcat(pxVar3,*(xmlChar **)(item + 1));
        *buf = pxVar3;
      }
      else {
        pxVar2 = xmlSchemaFormatQName
                           (&local_30,*(xmlChar **)((long)item[4].dummy + 0x10),
                            *(xmlChar **)(item + 1));
        pxVar3 = xmlStrcat(pxVar3,pxVar2);
        *buf = pxVar3;
        if (local_30 != (xmlChar *)0x0) {
          (*xmlFree)(local_30);
          local_30 = (xmlChar *)0x0;
          pxVar3 = *buf;
        }
      }
      pxVar3 = xmlStrcat(pxVar3,"\'");
      *buf = pxVar3;
    }
  }
LAB_0018a982:
  if (local_30 != (xmlChar *)0x0) {
    (*xmlFree)(local_30);
  }
  pxVar3 = xmlEscapeFormatString(buf);
  return pxVar3;
}

Assistant:

static xmlChar*
xmlSchemaFormatItemForReport(xmlChar **buf,
		     const xmlChar *itemDes,
		     xmlSchemaBasicItemPtr item,
		     xmlNodePtr itemNode)
{
    xmlChar *str = NULL;
    int named = 1;

    if (*buf != NULL) {
	xmlFree(*buf);
	*buf = NULL;
    }

    if (itemDes != NULL) {
	*buf = xmlStrdup(itemDes);
    } else if (item != NULL) {
	switch (item->type) {
	case XML_SCHEMA_TYPE_BASIC: {
	    xmlSchemaTypePtr type = WXS_TYPE_CAST item;

	    if (WXS_IS_ATOMIC(type))
		*buf = xmlStrdup(BAD_CAST "atomic type 'xs:");
	    else if (WXS_IS_LIST(type))
		*buf = xmlStrdup(BAD_CAST "list type 'xs:");
	    else if (WXS_IS_UNION(type))
		*buf = xmlStrdup(BAD_CAST "union type 'xs:");
	    else
		*buf = xmlStrdup(BAD_CAST "simple type 'xs:");
	    *buf = xmlStrcat(*buf, type->name);
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    break;
	case XML_SCHEMA_TYPE_SIMPLE: {
	    xmlSchemaTypePtr type = WXS_TYPE_CAST item;

	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL) {
		*buf = xmlStrdup(BAD_CAST"");
	    } else {
		*buf = xmlStrdup(BAD_CAST "local ");
	    }
	    if (WXS_IS_ATOMIC(type))
		*buf = xmlStrcat(*buf, BAD_CAST "atomic type");
	    else if (WXS_IS_LIST(type))
		*buf = xmlStrcat(*buf, BAD_CAST "list type");
	    else if (WXS_IS_UNION(type))
		*buf = xmlStrcat(*buf, BAD_CAST "union type");
	    else
		*buf = xmlStrcat(*buf, BAD_CAST "simple type");
	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL) {
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, type->name);
		*buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    }
	    break;
	case XML_SCHEMA_TYPE_COMPLEX: {
	    xmlSchemaTypePtr type = WXS_TYPE_CAST item;

	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL)
		*buf = xmlStrdup(BAD_CAST "");
	    else
		*buf = xmlStrdup(BAD_CAST "local ");
	    *buf = xmlStrcat(*buf, BAD_CAST "complex type");
	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL) {
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, type->name);
		*buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    }
	    break;
	case XML_SCHEMA_TYPE_ATTRIBUTE_USE: {
		xmlSchemaAttributeUsePtr ause;

		ause = WXS_ATTR_USE_CAST item;
		*buf = xmlStrdup(BAD_CAST "attribute use ");
		if (WXS_ATTRUSE_DECL(ause) != NULL) {
		    *buf = xmlStrcat(*buf, BAD_CAST "'");
		    *buf = xmlStrcat(*buf,
			xmlSchemaGetComponentQName(&str, WXS_ATTRUSE_DECL(ause)));
		    FREE_AND_NULL(str)
			*buf = xmlStrcat(*buf, BAD_CAST "'");
		} else {
		    *buf = xmlStrcat(*buf, BAD_CAST "(unknown)");
		}
	    }
	    break;
	case XML_SCHEMA_TYPE_ATTRIBUTE: {
		xmlSchemaAttributePtr attr;

		attr = (xmlSchemaAttributePtr) item;
		*buf = xmlStrdup(BAD_CAST "attribute decl.");
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaFormatQName(&str,
		    attr->targetNamespace, attr->name));
		FREE_AND_NULL(str)
		    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    break;
	case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
	    xmlSchemaGetComponentDesignation(buf, item);
	    break;
	case XML_SCHEMA_TYPE_ELEMENT: {
		xmlSchemaElementPtr elem;

		elem = (xmlSchemaElementPtr) item;
		*buf = xmlStrdup(BAD_CAST "element decl.");
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaFormatQName(&str,
		    elem->targetNamespace, elem->name));
		*buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    break;
	case XML_SCHEMA_TYPE_IDC_UNIQUE:
	case XML_SCHEMA_TYPE_IDC_KEY:
	case XML_SCHEMA_TYPE_IDC_KEYREF:
	    if (item->type == XML_SCHEMA_TYPE_IDC_UNIQUE)
		*buf = xmlStrdup(BAD_CAST "unique '");
	    else if (item->type == XML_SCHEMA_TYPE_IDC_KEY)
		*buf = xmlStrdup(BAD_CAST "key '");
	    else
		*buf = xmlStrdup(BAD_CAST "keyRef '");
	    *buf = xmlStrcat(*buf, ((xmlSchemaIDCPtr) item)->name);
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    break;
	case XML_SCHEMA_TYPE_ANY:
	case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
	    *buf = xmlStrdup(xmlSchemaWildcardPCToString(
		    ((xmlSchemaWildcardPtr) item)->processContents));
	    *buf = xmlStrcat(*buf, BAD_CAST " wildcard");
	    break;
	case XML_SCHEMA_FACET_MININCLUSIVE:
	case XML_SCHEMA_FACET_MINEXCLUSIVE:
	case XML_SCHEMA_FACET_MAXINCLUSIVE:
	case XML_SCHEMA_FACET_MAXEXCLUSIVE:
	case XML_SCHEMA_FACET_TOTALDIGITS:
	case XML_SCHEMA_FACET_FRACTIONDIGITS:
	case XML_SCHEMA_FACET_PATTERN:
	case XML_SCHEMA_FACET_ENUMERATION:
	case XML_SCHEMA_FACET_WHITESPACE:
	case XML_SCHEMA_FACET_LENGTH:
	case XML_SCHEMA_FACET_MAXLENGTH:
	case XML_SCHEMA_FACET_MINLENGTH:
	    *buf = xmlStrdup(BAD_CAST "facet '");
	    *buf = xmlStrcat(*buf, xmlSchemaFacetTypeToString(item->type));
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    break;
	case XML_SCHEMA_TYPE_GROUP: {
		*buf = xmlStrdup(BAD_CAST "model group def.");
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaGetComponentQName(&str, item));
		*buf = xmlStrcat(*buf, BAD_CAST "'");
		FREE_AND_NULL(str)
	    }
	    break;
	case XML_SCHEMA_TYPE_SEQUENCE:
	case XML_SCHEMA_TYPE_CHOICE:
	case XML_SCHEMA_TYPE_ALL:
	case XML_SCHEMA_TYPE_PARTICLE:
	    *buf = xmlStrdup(WXS_ITEM_TYPE_NAME(item));
	    break;
	case XML_SCHEMA_TYPE_NOTATION: {
		*buf = xmlStrdup(WXS_ITEM_TYPE_NAME(item));
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaGetComponentQName(&str, item));
		*buf = xmlStrcat(*buf, BAD_CAST "'");
		FREE_AND_NULL(str);
	    }
            /* Falls through. */
	default:
	    named = 0;
	}
    } else
	named = 0;

    if ((named == 0) && (itemNode != NULL)) {
	xmlNodePtr elem;

	if (itemNode->type == XML_ATTRIBUTE_NODE)
	    elem = itemNode->parent;
	else
	    elem = itemNode;
	*buf = xmlStrdup(BAD_CAST "Element '");
	if (elem->ns != NULL) {
	    *buf = xmlStrcat(*buf,
		xmlSchemaFormatQName(&str, elem->ns->href, elem->name));
	    FREE_AND_NULL(str)
	} else
	    *buf = xmlStrcat(*buf, elem->name);
	*buf = xmlStrcat(*buf, BAD_CAST "'");

    }
    if ((itemNode != NULL) && (itemNode->type == XML_ATTRIBUTE_NODE)) {
	*buf = xmlStrcat(*buf, BAD_CAST ", attribute '");
	if (itemNode->ns != NULL) {
	    *buf = xmlStrcat(*buf, xmlSchemaFormatQName(&str,
		itemNode->ns->href, itemNode->name));
	    FREE_AND_NULL(str)
	} else
	    *buf = xmlStrcat(*buf, itemNode->name);
	*buf = xmlStrcat(*buf, BAD_CAST "'");
    }
    FREE_AND_NULL(str)

    return (xmlEscapeFormatString(buf));
}